

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_compareTo(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  uint uVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  vm_val_t *in_RDI;
  int delta;
  utf8_ptr b;
  utf8_ptr a;
  size_t olen;
  char *other;
  size_t len;
  vm_val_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  utf8_ptr *in_stack_ffffffffffffffa0;
  
  if ((getp_compareTo(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_compareTo(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_compareTo::desc,1);
    __cxa_guard_release(&getp_compareTo(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (uint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff88);
  if (iVar2 == 0) {
    sVar5 = vmb_get_len((char *)0x33c482);
    CVmStack::get(0);
    pcVar6 = vm_val_t::get_as_string(in_stack_ffffffffffffff88);
    if (pcVar6 == (char *)0x0) {
      err_throw(0);
    }
    sVar7 = vmb_get_len((char *)0x33c4c7);
    vm_val_t::set_nil(in_RDI);
    utf8_ptr::utf8_ptr((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (char *)in_stack_ffffffffffffff88);
    utf8_ptr::utf8_ptr((utf8_ptr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (char *)in_stack_ffffffffffffff88);
    while( true ) {
      uVar1 = in_stack_ffffffffffffff98 & 0xffffff;
      if (sVar5 != 0) {
        uVar1 = CONCAT13(sVar7 != 0,(int3)in_stack_ffffffffffffff98);
      }
      in_stack_ffffffffffffff98 = uVar1;
      if ((char)(in_stack_ffffffffffffff98 >> 0x18) == '\0') goto LAB_0033c587;
      wVar3 = utf8_ptr::getch((utf8_ptr *)0x33c531);
      wVar4 = utf8_ptr::getch((utf8_ptr *)0x33c53f);
      iVar2 = wVar3 - wVar4;
      if (iVar2 != 0) break;
      utf8_ptr::inc(in_stack_ffffffffffffffa0,(size_t *)(ulong)in_stack_ffffffffffffff98);
      utf8_ptr::inc(in_stack_ffffffffffffffa0,(size_t *)CONCAT44(iVar2,in_stack_ffffffffffffff98));
    }
    vm_val_t::set_int(in_RDI,iVar2);
LAB_0033c587:
    if (in_RDI->typ == VM_NIL) {
      vm_val_t::set_int(in_RDI,(int)sVar5 - (int)sVar7);
    }
    CVmStack::discard(1);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_compareTo(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* get the other string (leave it on the stack for gc protection) */
    const char *other = G_stk->get(0)->get_as_string(vmg0_);
    if (other == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get its buffer and length */
    size_t olen = vmb_get_len(other);
    other += VMB_LEN;

    /* no result yet */
    retval->set_nil();

    /* compare character by character */
    utf8_ptr a((char *)str);
    utf8_ptr b((char *)other);
    for ( ; len != 0 && olen != 0 ; a.inc(&len), b.inc(&olen))
    {
        int delta = (int)a.getch() - (int)b.getch();
        if (delta != 0)
        {
            retval->set_int(delta);
            break;
        }
    }

    /* if we didn't find any differences, the shorter string sorts first */
    if (retval->typ == VM_NIL)
        retval->set_int(len - olen);

    /* discard arguments */
    G_stk->discard(1);

    /* done */
    return TRUE;
}